

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QCommonArrayOps<QGlyphRun>::
appendIteratorRange<QHash<std::pair<QFontEngine*,int>,QGlyphRun>::const_iterator>
          (QCommonArrayOps<QGlyphRun> *this,const_iterator b,const_iterator e,
          IfIsForwardIterator<QHash<std::pair<QFontEngine_*,_int>,_QGlyphRun>::const_iterator>
          param_3)

{
  qsizetype *pqVar1;
  ulong uVar2;
  Data<QHashPrivate::Node<std::pair<QFontEngine_*,_int>,_QGlyphRun>_> *pDVar3;
  QGlyphRun *this_00;
  long in_FS_OFFSET;
  iterator<QHashPrivate::Node<std::pair<QFontEngine_*,_int>,_QGlyphRun>_> local_48;
  long local_38;
  
  uVar2 = b.i.bucket;
  pDVar3 = b.i.d;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.d = pDVar3;
  local_48.bucket = uVar2;
  std::__distance<QHash<std::pair<QFontEngine*,int>,QGlyphRun>::const_iterator>
            (pDVar3,uVar2,e.i.d,e.i.bucket);
  this_00 = (this->super_Type).super_QGenericArrayOps<QGlyphRun>.super_QArrayDataPointer<QGlyphRun>.
            ptr + (this->super_Type).super_QGenericArrayOps<QGlyphRun>.
                  super_QArrayDataPointer<QGlyphRun>.size;
  while (uVar2 != e.i.bucket || pDVar3 != e.i.d) {
    QGlyphRun::QGlyphRun
              (this_00,(QGlyphRun *)
                       (pDVar3->spans[uVar2 >> 7].entries
                        [pDVar3->spans[uVar2 >> 7].offsets[(uint)uVar2 & 0x7f]].storage.data + 0x10)
              );
    pqVar1 = &(this->super_Type).super_QGenericArrayOps<QGlyphRun>.
              super_QArrayDataPointer<QGlyphRun>.size;
    *pqVar1 = *pqVar1 + 1;
    this_00 = this_00 + 1;
    QHashPrivate::iterator<QHashPrivate::Node<std::pair<QFontEngine_*,_int>,_QGlyphRun>_>::
    operator++(&local_48);
    uVar2 = local_48.bucket;
    pDVar3 = local_48.d;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void appendIteratorRange(It b, It e, QtPrivate::IfIsForwardIterator<It> = true)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        const qsizetype distance = std::distance(b, e);
        Q_ASSERT(distance >= 0 && distance <= this->allocatedCapacity() - this->size);
        Q_UNUSED(distance);

#if __cplusplus >= 202002L && defined(__cpp_concepts) && defined(__cpp_lib_concepts)
        constexpr bool canUseCopyAppend =
                std::contiguous_iterator<It> &&
                std::is_same_v<
                    std::remove_cv_t<typename std::iterator_traits<It>::value_type>,
                    T
                >;
        if constexpr (canUseCopyAppend) {
            this->copyAppend(std::to_address(b), std::to_address(e));
        } else
#endif
        {
            T *iter = this->end();
            for (; b != e; ++iter, ++b) {
                new (iter) T(*b);
                ++this->size;
            }
        }
    }